

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O1

void fdct16x32_avx2(__m256i *input,__m256i *output,int8_t cos_bit)

{
  int iVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  __m256i alVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  long lVar25;
  uint uVar26;
  int iVar27;
  undefined7 in_register_00000011;
  uint uVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  longlong local_3f8;
  longlong lStack_3f0;
  longlong lStack_3e8;
  longlong lStack_3e0;
  longlong local_3d8;
  longlong lStack_3d0;
  longlong lStack_3c8;
  longlong lStack_3c0;
  longlong local_398;
  longlong lStack_390;
  longlong lStack_388;
  longlong lStack_380;
  longlong local_378;
  longlong lStack_370;
  longlong lStack_368;
  longlong lStack_360;
  longlong local_2f8;
  longlong lStack_2f0;
  longlong lStack_2e8;
  longlong lStack_2e0;
  longlong local_2d8;
  longlong lStack_2d0;
  longlong lStack_2c8;
  longlong lStack_2c0;
  longlong local_298;
  longlong lStack_290;
  longlong lStack_288;
  longlong lStack_280;
  longlong local_278;
  longlong lStack_270;
  longlong lStack_268;
  longlong lStack_260;
  longlong local_258;
  longlong lStack_250;
  longlong lStack_248;
  longlong lStack_240;
  longlong local_238;
  longlong lStack_230;
  longlong lStack_228;
  longlong lStack_220;
  longlong local_218;
  longlong lStack_210;
  longlong lStack_208;
  longlong lStack_200;
  longlong local_1b8;
  longlong lStack_1b0;
  longlong lStack_1a8;
  longlong lStack_1a0;
  longlong local_198;
  longlong lStack_190;
  longlong lStack_188;
  longlong lStack_180;
  longlong local_178;
  longlong lStack_170;
  longlong lStack_168;
  longlong lStack_160;
  longlong local_158;
  longlong lStack_150;
  longlong lStack_148;
  longlong lStack_140;
  longlong local_138;
  longlong lStack_130;
  longlong lStack_128;
  longlong lStack_120;
  longlong local_118;
  longlong lStack_110;
  longlong lStack_108;
  longlong lStack_100;
  longlong local_f8;
  longlong lStack_f0;
  longlong lStack_e8;
  longlong lStack_e0;
  longlong local_d8;
  longlong lStack_d0;
  longlong lStack_c8;
  longlong lStack_c0;
  longlong local_b8;
  longlong lStack_b0;
  longlong lStack_a8;
  longlong lStack_a0;
  longlong local_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong lStack_80;
  
  auVar13 = vpaddsw_avx2((undefined1  [32])*input,(undefined1  [32])input[0x1f]);
  auVar23 = vpsubsw_avx2((undefined1  [32])*input,(undefined1  [32])input[0x1f]);
  auVar37 = vpaddsw_avx2((undefined1  [32])input[1],(undefined1  [32])input[0x1e]);
  auVar53 = vpsubsw_avx2((undefined1  [32])input[1],(undefined1  [32])input[0x1e]);
  auVar14 = vpaddsw_avx2((undefined1  [32])input[2],(undefined1  [32])input[0x1d]);
  auVar45 = vpsubsw_avx2((undefined1  [32])input[2],(undefined1  [32])input[0x1d]);
  auVar15 = vpaddsw_avx2((undefined1  [32])input[3],(undefined1  [32])input[0x1c]);
  auVar54 = vpsubsw_avx2((undefined1  [32])input[3],(undefined1  [32])input[0x1c]);
  auVar16 = vpaddsw_avx2((undefined1  [32])input[4],(undefined1  [32])input[0x1b]);
  auVar24 = vpsubsw_avx2((undefined1  [32])input[4],(undefined1  [32])input[0x1b]);
  auVar17 = vpaddsw_avx2((undefined1  [32])input[5],(undefined1  [32])input[0x1a]);
  auVar51 = vpsubsw_avx2((undefined1  [32])input[5],(undefined1  [32])input[0x1a]);
  auVar18 = vpaddsw_avx2((undefined1  [32])input[6],(undefined1  [32])input[0x19]);
  auVar62 = vpsubsw_avx2((undefined1  [32])input[6],(undefined1  [32])input[0x19]);
  auVar40 = vpaddsw_avx2((undefined1  [32])input[7],(undefined1  [32])input[0x18]);
  auVar52 = vpsubsw_avx2((undefined1  [32])input[7],(undefined1  [32])input[0x18]);
  auVar68 = vpaddsw_avx2((undefined1  [32])input[8],(undefined1  [32])input[0x17]);
  auVar48 = vpsubsw_avx2((undefined1  [32])input[8],(undefined1  [32])input[0x17]);
  auVar41 = vpaddsw_avx2((undefined1  [32])input[9],(undefined1  [32])input[0x16]);
  auVar64 = vpsubsw_avx2((undefined1  [32])input[9],(undefined1  [32])input[0x16]);
  auVar19 = vpaddsw_avx2((undefined1  [32])input[0x15],(undefined1  [32])input[10]);
  auVar47 = vpsubsw_avx2((undefined1  [32])input[10],(undefined1  [32])input[0x15]);
  auVar20 = vpaddsw_avx2((undefined1  [32])input[0xb],(undefined1  [32])input[0x14]);
  auVar63 = vpsubsw_avx2((undefined1  [32])input[0xb],(undefined1  [32])input[0x14]);
  auVar21 = vpaddsw_avx2((undefined1  [32])input[0xc],(undefined1  [32])input[0x13]);
  auVar55 = vpsubsw_avx2((undefined1  [32])input[0xc],(undefined1  [32])input[0x13]);
  auVar22 = vpaddsw_avx2((undefined1  [32])input[0xd],(undefined1  [32])input[0x12]);
  auVar35 = vpsubsw_avx2((undefined1  [32])input[0xd],(undefined1  [32])input[0x12]);
  auVar42 = vpaddsw_avx2((undefined1  [32])input[0xe],(undefined1  [32])input[0x11]);
  auVar46 = vpsubsw_avx2((undefined1  [32])input[0xe],(undefined1  [32])input[0x11]);
  auVar43 = vpaddsw_avx2((undefined1  [32])input[0xf],(undefined1  [32])input[0x10]);
  auVar66 = vpsubsw_avx2((undefined1  [32])input[0xf],(undefined1  [32])input[0x10]);
  auVar60 = vpaddsw_avx2(auVar13,auVar43);
  auVar56 = vpsubsw_avx2(auVar13,auVar43);
  auVar43 = vpaddsw_avx2(auVar37,auVar42);
  auVar67 = vpsubsw_avx2(auVar37,auVar42);
  auVar42 = vpaddsw_avx2(auVar14,auVar22);
  auVar57 = vpsubsw_avx2(auVar14,auVar22);
  auVar22 = vpaddsw_avx2(auVar15,auVar21);
  auVar58 = vpsubsw_avx2(auVar15,auVar21);
  auVar21 = vpaddsw_avx2(auVar16,auVar20);
  auVar34 = vpsubsw_avx2(auVar16,auVar20);
  auVar20 = vpaddsw_avx2(auVar17,auVar19);
  auVar38 = vpsubsw_avx2(auVar17,auVar19);
  auVar19 = vpaddsw_avx2(auVar18,auVar41);
  auVar49 = vpsubsw_avx2(auVar18,auVar41);
  auVar50 = vpaddsw_avx2(auVar40,auVar68);
  auVar36 = vpsubsw_avx2(auVar40,auVar68);
  auVar37 = vpunpcklwd_avx2(auVar63,auVar24);
  auVar15 = vpunpckhwd_avx2(auVar63,auVar24);
  uVar26 = (uint)CONCAT71(in_register_00000011,cos_bit);
  lVar29 = (long)(int)uVar26;
  lVar25 = lVar29 * 0x100;
  iVar27 = 1 << (cos_bit - 1U & 0x1f);
  auVar32._4_4_ = iVar27;
  auVar32._0_4_ = iVar27;
  auVar32._8_4_ = iVar27;
  auVar32._12_4_ = iVar27;
  auVar32._16_4_ = iVar27;
  auVar32._20_4_ = iVar27;
  auVar32._24_4_ = iVar27;
  auVar32._28_4_ = iVar27;
  uVar31 = *(uint *)(&DAT_004e0da0 + lVar25);
  uVar30 = -uVar31 & 0xffff | uVar31 * 0x10000;
  auVar59._4_4_ = uVar30;
  auVar59._0_4_ = uVar30;
  auVar59._8_4_ = uVar30;
  auVar59._12_4_ = uVar30;
  auVar59._16_4_ = uVar30;
  auVar59._20_4_ = uVar30;
  auVar59._24_4_ = uVar30;
  auVar59._28_4_ = uVar30;
  iVar27 = uVar31 * 0x10000 + (uVar31 & 0xffff);
  auVar65._4_4_ = iVar27;
  auVar65._0_4_ = iVar27;
  auVar65._8_4_ = iVar27;
  auVar65._12_4_ = iVar27;
  auVar65._16_4_ = iVar27;
  auVar65._20_4_ = iVar27;
  auVar65._24_4_ = iVar27;
  auVar65._28_4_ = iVar27;
  auVar13 = vpmaddwd_avx2(auVar59,auVar37);
  auVar14 = vpmaddwd_avx2(auVar65,auVar37);
  auVar37 = vpmaddwd_avx2(auVar59,auVar15);
  auVar15 = vpmaddwd_avx2(auVar65,auVar15);
  auVar13 = vpaddd_avx2(auVar13,auVar32);
  auVar37 = vpaddd_avx2(auVar37,auVar32);
  auVar14 = vpaddd_avx2(auVar14,auVar32);
  auVar15 = vpaddd_avx2(auVar15,auVar32);
  auVar13 = vpsrad_avx2(auVar13,ZEXT416(uVar26));
  auVar37 = vpsrad_avx2(auVar37,ZEXT416(uVar26));
  auVar33 = ZEXT416(uVar26);
  auVar14 = vpsrad_avx2(auVar14,auVar33);
  auVar15 = vpsrad_avx2(auVar15,auVar33);
  auVar13 = vpackssdw_avx2(auVar13,auVar37);
  auVar37 = vpackssdw_avx2(auVar14,auVar15);
  auVar15 = vpunpcklwd_avx2(auVar47,auVar51);
  auVar17 = vpunpckhwd_avx2(auVar47,auVar51);
  auVar14 = vpmaddwd_avx2(auVar59,auVar15);
  auVar16 = vpmaddwd_avx2(auVar65,auVar15);
  auVar15 = vpmaddwd_avx2(auVar59,auVar17);
  auVar17 = vpmaddwd_avx2(auVar65,auVar17);
  auVar14 = vpaddd_avx2(auVar14,auVar32);
  auVar15 = vpaddd_avx2(auVar15,auVar32);
  auVar16 = vpaddd_avx2(auVar16,auVar32);
  auVar17 = vpaddd_avx2(auVar17,auVar32);
  auVar14 = vpsrad_avx2(auVar14,auVar33);
  auVar15 = vpsrad_avx2(auVar15,auVar33);
  auVar33 = ZEXT416(uVar26);
  auVar16 = vpsrad_avx2(auVar16,auVar33);
  auVar17 = vpsrad_avx2(auVar17,auVar33);
  auVar14 = vpackssdw_avx2(auVar14,auVar15);
  auVar15 = vpackssdw_avx2(auVar16,auVar17);
  auVar17 = vpunpcklwd_avx2(auVar64,auVar62);
  auVar40 = vpunpckhwd_avx2(auVar64,auVar62);
  auVar16 = vpmaddwd_avx2(auVar59,auVar17);
  auVar18 = vpmaddwd_avx2(auVar65,auVar17);
  auVar17 = vpmaddwd_avx2(auVar59,auVar40);
  auVar40 = vpmaddwd_avx2(auVar65,auVar40);
  auVar16 = vpaddd_avx2(auVar16,auVar32);
  auVar17 = vpaddd_avx2(auVar17,auVar32);
  auVar18 = vpaddd_avx2(auVar18,auVar32);
  auVar40 = vpaddd_avx2(auVar40,auVar32);
  auVar16 = vpsrad_avx2(auVar16,auVar33);
  auVar17 = vpsrad_avx2(auVar17,auVar33);
  auVar18 = vpsrad_avx2(auVar18,auVar33);
  auVar40 = vpsrad_avx2(auVar40,auVar33);
  auVar16 = vpackssdw_avx2(auVar16,auVar17);
  auVar17 = vpackssdw_avx2(auVar18,auVar40);
  auVar40 = vpunpcklwd_avx2(auVar48,auVar52);
  auVar41 = vpunpckhwd_avx2(auVar48,auVar52);
  auVar18 = vpmaddwd_avx2(auVar59,auVar40);
  auVar68 = vpmaddwd_avx2(auVar65,auVar40);
  auVar40 = vpmaddwd_avx2(auVar59,auVar41);
  auVar41 = vpmaddwd_avx2(auVar65,auVar41);
  auVar18 = vpaddd_avx2(auVar18,auVar32);
  auVar40 = vpaddd_avx2(auVar40,auVar32);
  auVar68 = vpaddd_avx2(auVar68,auVar32);
  auVar41 = vpaddd_avx2(auVar41,auVar32);
  auVar18 = vpsrad_avx2(auVar18,auVar33);
  auVar40 = vpsrad_avx2(auVar40,auVar33);
  auVar33 = ZEXT416(uVar26);
  auVar68 = vpsrad_avx2(auVar68,auVar33);
  auVar41 = vpsrad_avx2(auVar41,auVar33);
  auVar18 = vpackssdw_avx2(auVar18,auVar40);
  auVar40 = vpackssdw_avx2(auVar68,auVar41);
  auVar24 = vpaddsw_avx2(auVar50,auVar60);
  auVar48 = vpsubsw_avx2(auVar60,auVar50);
  auVar60 = vpaddsw_avx2(auVar43,auVar19);
  auVar50 = vpsubsw_avx2(auVar43,auVar19);
  auVar43 = vpaddsw_avx2(auVar42,auVar20);
  auVar64 = vpsubsw_avx2(auVar42,auVar20);
  auVar42 = vpaddsw_avx2(auVar22,auVar21);
  auVar47 = vpsubsw_avx2(auVar22,auVar21);
  auVar41 = vpunpcklwd_avx2(auVar38,auVar57);
  auVar20 = vpunpckhwd_avx2(auVar38,auVar57);
  auVar68 = vpmaddwd_avx2(auVar59,auVar41);
  auVar19 = vpmaddwd_avx2(auVar65,auVar41);
  auVar41 = vpmaddwd_avx2(auVar59,auVar20);
  auVar20 = vpmaddwd_avx2(auVar65,auVar20);
  auVar68 = vpaddd_avx2(auVar68,auVar32);
  auVar41 = vpaddd_avx2(auVar41,auVar32);
  auVar19 = vpaddd_avx2(auVar19,auVar32);
  auVar20 = vpaddd_avx2(auVar20,auVar32);
  auVar68 = vpsrad_avx2(auVar68,auVar33);
  auVar41 = vpsrad_avx2(auVar41,auVar33);
  auVar19 = vpsrad_avx2(auVar19,auVar33);
  auVar20 = vpsrad_avx2(auVar20,auVar33);
  auVar68 = vpackssdw_avx2(auVar68,auVar41);
  auVar41 = vpackssdw_avx2(auVar19,auVar20);
  auVar20 = vpunpcklwd_avx2(auVar34,auVar58);
  auVar22 = vpunpckhwd_avx2(auVar34,auVar58);
  auVar19 = vpmaddwd_avx2(auVar59,auVar20);
  auVar21 = vpmaddwd_avx2(auVar65,auVar20);
  auVar20 = vpmaddwd_avx2(auVar59,auVar22);
  auVar22 = vpmaddwd_avx2(auVar65,auVar22);
  auVar19 = vpaddd_avx2(auVar19,auVar32);
  auVar20 = vpaddd_avx2(auVar20,auVar32);
  auVar21 = vpaddd_avx2(auVar21,auVar32);
  auVar22 = vpaddd_avx2(auVar22,auVar32);
  auVar19 = vpsrad_avx2(auVar19,auVar33);
  auVar20 = vpsrad_avx2(auVar20,auVar33);
  auVar21 = vpsrad_avx2(auVar21,auVar33);
  auVar22 = vpsrad_avx2(auVar22,auVar33);
  auVar19 = vpackssdw_avx2(auVar19,auVar20);
  auVar20 = vpackssdw_avx2(auVar21,auVar22);
  auVar51 = vpaddsw_avx2(auVar66,auVar18);
  auVar63 = vpsubsw_avx2(auVar66,auVar18);
  auVar62 = vpaddsw_avx2(auVar46,auVar16);
  auVar46 = vpsubsw_avx2(auVar46,auVar16);
  auVar16 = vpaddsw_avx2(auVar35,auVar14);
  auVar35 = vpsubsw_avx2(auVar35,auVar14);
  auVar18 = vpaddsw_avx2(auVar55,auVar13);
  auVar55 = vpsubsw_avx2(auVar55,auVar13);
  auVar52 = vpaddsw_avx2(auVar23,auVar40);
  auVar66 = vpsubsw_avx2(auVar23,auVar40);
  auVar23 = vpaddsw_avx2(auVar53,auVar17);
  auVar57 = vpsubsw_avx2(auVar53,auVar17);
  auVar17 = vpaddsw_avx2(auVar45,auVar15);
  auVar45 = vpsubsw_avx2(auVar45,auVar15);
  auVar40 = vpaddsw_avx2(auVar54,auVar37);
  auVar54 = vpsubsw_avx2(auVar54,auVar37);
  auVar21 = vpaddsw_avx2(auVar42,auVar24);
  auVar42 = vpsubsw_avx2(auVar24,auVar42);
  auVar22 = vpaddsw_avx2(auVar43,auVar60);
  auVar43 = vpsubsw_avx2(auVar60,auVar43);
  auVar14 = vpunpcklwd_avx2(auVar64,auVar50);
  auVar15 = vpunpckhwd_avx2(auVar64,auVar50);
  auVar13 = vpmaddwd_avx2(auVar59,auVar14);
  auVar37 = vpmaddwd_avx2(auVar15,auVar59);
  auVar14 = vpmaddwd_avx2(auVar65,auVar14);
  auVar15 = vpmaddwd_avx2(auVar15,auVar65);
  auVar13 = vpaddd_avx2(auVar13,auVar32);
  auVar37 = vpaddd_avx2(auVar37,auVar32);
  auVar14 = vpaddd_avx2(auVar14,auVar32);
  auVar15 = vpaddd_avx2(auVar15,auVar32);
  auVar13 = vpsrad_avx2(auVar13,auVar33);
  auVar37 = vpsrad_avx2(auVar37,auVar33);
  auVar14 = vpsrad_avx2(auVar14,auVar33);
  auVar15 = vpsrad_avx2(auVar15,auVar33);
  auVar13 = vpackssdw_avx2(auVar13,auVar37);
  auVar37 = vpackssdw_avx2(auVar14,auVar15);
  auVar24 = vpaddsw_avx2(auVar36,auVar19);
  auVar58 = vpsubsw_avx2(auVar36,auVar19);
  auVar60 = vpaddsw_avx2(auVar68,auVar49);
  auVar64 = vpsubsw_avx2(auVar49,auVar68);
  auVar53 = vpaddsw_avx2(auVar20,auVar56);
  auVar56 = vpsubsw_avx2(auVar56,auVar20);
  auVar50 = vpaddsw_avx2(auVar67,auVar41);
  auVar67 = vpsubsw_avx2(auVar67,auVar41);
  auVar15 = vpunpcklwd_avx2(auVar16,auVar17);
  auVar17 = vpunpckhwd_avx2(auVar16,auVar17);
  iVar27 = *(int *)(&DAT_004e0d60 + lVar29 * 0x20);
  uVar30 = *(uint *)(&DAT_004e0de0 + lVar25);
  uVar28 = uVar30 << 0x10 | -iVar27 & 0xffffU;
  auVar49._4_4_ = uVar28;
  auVar49._0_4_ = uVar28;
  auVar49._8_4_ = uVar28;
  auVar49._12_4_ = uVar28;
  auVar49._16_4_ = uVar28;
  auVar49._20_4_ = uVar28;
  auVar49._24_4_ = uVar28;
  auVar49._28_4_ = uVar28;
  uVar28 = uVar30 & 0xffff | iVar27 * 0x10000;
  auVar34._4_4_ = uVar28;
  auVar34._0_4_ = uVar28;
  auVar34._8_4_ = uVar28;
  auVar34._12_4_ = uVar28;
  auVar34._16_4_ = uVar28;
  auVar34._20_4_ = uVar28;
  auVar34._24_4_ = uVar28;
  auVar34._28_4_ = uVar28;
  auVar14 = vpmaddwd_avx2(auVar15,auVar49);
  auVar16 = vpmaddwd_avx2(auVar15,auVar34);
  auVar15 = vpmaddwd_avx2(auVar17,auVar49);
  auVar17 = vpmaddwd_avx2(auVar17,auVar34);
  auVar14 = vpaddd_avx2(auVar14,auVar32);
  auVar15 = vpaddd_avx2(auVar15,auVar32);
  auVar16 = vpaddd_avx2(auVar16,auVar32);
  auVar17 = vpaddd_avx2(auVar17,auVar32);
  auVar14 = vpsrad_avx2(auVar14,auVar33);
  auVar15 = vpsrad_avx2(auVar15,auVar33);
  auVar33 = ZEXT416(uVar26);
  auVar16 = vpsrad_avx2(auVar16,auVar33);
  auVar17 = vpsrad_avx2(auVar17,auVar33);
  auVar14 = vpackssdw_avx2(auVar14,auVar15);
  auVar15 = vpackssdw_avx2(auVar16,auVar17);
  auVar68 = vpunpcklwd_avx2(auVar18,auVar40);
  auVar18 = vpunpckhwd_avx2(auVar18,auVar40);
  auVar16 = vpmaddwd_avx2(auVar68,auVar49);
  auVar16 = vpaddd_avx2(auVar16,auVar32);
  auVar17 = vpmaddwd_avx2(auVar18,auVar49);
  auVar17 = vpaddd_avx2(auVar17,auVar32);
  auVar16 = vpsrad_avx2(auVar16,auVar33);
  auVar17 = vpsrad_avx2(auVar17,auVar33);
  auVar16 = vpackssdw_avx2(auVar16,auVar17);
  auVar20 = vpunpcklwd_avx2(auVar55,auVar54);
  auVar19 = vpunpckhwd_avx2(auVar55,auVar54);
  iVar27 = (-uVar30 & 0xffff) + iVar27 * -0x10000;
  auVar38._4_4_ = iVar27;
  auVar38._0_4_ = iVar27;
  auVar38._8_4_ = iVar27;
  auVar38._12_4_ = iVar27;
  auVar38._16_4_ = iVar27;
  auVar38._20_4_ = iVar27;
  auVar38._24_4_ = iVar27;
  auVar38._28_4_ = iVar27;
  auVar17 = vpmaddwd_avx2(auVar68,auVar34);
  auVar18 = vpmaddwd_avx2(auVar18,auVar34);
  auVar17 = vpaddd_avx2(auVar17,auVar32);
  auVar18 = vpaddd_avx2(auVar18,auVar32);
  auVar40 = vpsrad_avx2(auVar17,auVar33);
  auVar68 = vpsrad_avx2(auVar18,auVar33);
  auVar17 = vpmaddwd_avx2(auVar20,auVar38);
  auVar17 = vpaddd_avx2(auVar17,auVar32);
  auVar18 = vpmaddwd_avx2(auVar19,auVar38);
  auVar18 = vpaddd_avx2(auVar18,auVar32);
  auVar41 = vpsrad_avx2(auVar17,auVar33);
  auVar18 = vpsrad_avx2(auVar18,auVar33);
  auVar17 = vpackssdw_avx2(auVar40,auVar68);
  auVar18 = vpackssdw_avx2(auVar41,auVar18);
  auVar54 = vpunpcklwd_avx2(auVar35,auVar45);
  auVar45 = vpunpckhwd_avx2(auVar35,auVar45);
  auVar40 = vpmaddwd_avx2(auVar20,auVar49);
  auVar68 = vpmaddwd_avx2(auVar19,auVar49);
  auVar40 = vpaddd_avx2(auVar40,auVar32);
  auVar68 = vpaddd_avx2(auVar68,auVar32);
  auVar41 = vpsrad_avx2(auVar40,auVar33);
  auVar19 = vpsrad_avx2(auVar68,auVar33);
  auVar40 = vpmaddwd_avx2(auVar54,auVar38);
  auVar40 = vpaddd_avx2(auVar40,auVar32);
  auVar68 = vpmaddwd_avx2(auVar45,auVar38);
  auVar68 = vpaddd_avx2(auVar68,auVar32);
  auVar20 = vpsrad_avx2(auVar40,auVar33);
  auVar68 = vpsrad_avx2(auVar68,auVar33);
  auVar40 = vpackssdw_avx2(auVar41,auVar19);
  auVar68 = vpackssdw_avx2(auVar20,auVar68);
  auVar41 = vpmaddwd_avx2(auVar54,auVar49);
  auVar19 = vpmaddwd_avx2(auVar45,auVar49);
  auVar41 = vpaddd_avx2(auVar41,auVar32);
  auVar19 = vpaddd_avx2(auVar19,auVar32);
  auVar41 = vpsrad_avx2(auVar41,auVar33);
  auVar19 = vpsrad_avx2(auVar19,auVar33);
  auVar41 = vpackssdw_avx2(auVar41,auVar19);
  auVar45 = vpunpcklwd_avx2(auVar21,auVar22);
  auVar22 = vpunpckhwd_avx2(auVar21,auVar22);
  iVar27 = (uVar31 & 0xffff) + uVar31 * -0x10000;
  auVar55._4_4_ = iVar27;
  auVar55._0_4_ = iVar27;
  auVar55._8_4_ = iVar27;
  auVar55._12_4_ = iVar27;
  auVar55._16_4_ = iVar27;
  auVar55._20_4_ = iVar27;
  auVar55._24_4_ = iVar27;
  auVar55._28_4_ = iVar27;
  auVar19 = vpmaddwd_avx2(auVar65,auVar45);
  auVar20 = vpmaddwd_avx2(auVar65,auVar22);
  auVar21 = vpmaddwd_avx2(auVar55,auVar45);
  auVar22 = vpmaddwd_avx2(auVar55,auVar22);
  auVar19 = vpaddd_avx2(auVar19,auVar32);
  auVar20 = vpaddd_avx2(auVar20,auVar32);
  auVar21 = vpaddd_avx2(auVar21,auVar32);
  auVar22 = vpaddd_avx2(auVar22,auVar32);
  auVar19 = vpsrad_avx2(auVar19,auVar33);
  auVar20 = vpsrad_avx2(auVar20,auVar33);
  auVar21 = vpsrad_avx2(auVar21,auVar33);
  auVar22 = vpsrad_avx2(auVar22,auVar33);
  auVar19 = vpackssdw_avx2(auVar19,auVar20);
  auVar20 = vpackssdw_avx2(auVar21,auVar22);
  auVar22 = vpunpcklwd_avx2(auVar43,auVar42);
  auVar43 = vpunpckhwd_avx2(auVar43,auVar42);
  auVar21 = vpmaddwd_avx2(auVar22,auVar34);
  auVar42 = vpmaddwd_avx2(auVar22,auVar49);
  auVar22 = vpmaddwd_avx2(auVar43,auVar34);
  auVar43 = vpmaddwd_avx2(auVar43,auVar49);
  auVar21 = vpaddd_avx2(auVar21,auVar32);
  auVar22 = vpaddd_avx2(auVar22,auVar32);
  auVar42 = vpaddd_avx2(auVar42,auVar32);
  auVar43 = vpaddd_avx2(auVar43,auVar32);
  auVar21 = vpsrad_avx2(auVar21,auVar33);
  auVar22 = vpsrad_avx2(auVar22,auVar33);
  auVar42 = vpsrad_avx2(auVar42,auVar33);
  auVar43 = vpsrad_avx2(auVar43,auVar33);
  auVar21 = vpackssdw_avx2(auVar21,auVar22);
  auVar22 = vpackssdw_avx2(auVar42,auVar43);
  auVar45 = vpaddsw_avx2(auVar47,auVar13);
  auVar55 = vpsubsw_avx2(auVar47,auVar13);
  auVar54 = vpaddsw_avx2(auVar37,auVar48);
  auVar35 = vpsubsw_avx2(auVar48,auVar37);
  auVar42 = vpunpcklwd_avx2(auVar60,auVar50);
  auVar37 = vpunpckhwd_avx2(auVar60,auVar50);
  auVar13 = vpmaddwd_avx2(auVar42,auVar49);
  auVar42 = vpmaddwd_avx2(auVar42,auVar34);
  auVar43 = vpmaddwd_avx2(auVar37,auVar34);
  auVar37 = vpmaddwd_avx2(auVar37,auVar49);
  auVar13 = vpaddd_avx2(auVar13,auVar32);
  auVar37 = vpaddd_avx2(auVar37,auVar32);
  auVar42 = vpaddd_avx2(auVar42,auVar32);
  auVar43 = vpaddd_avx2(auVar43,auVar32);
  auVar13 = vpsrad_avx2(auVar13,auVar33);
  auVar37 = vpsrad_avx2(auVar37,auVar33);
  auVar42 = vpsrad_avx2(auVar42,auVar33);
  auVar43 = vpsrad_avx2(auVar43,auVar33);
  auVar13 = vpackssdw_avx2(auVar13,auVar37);
  auVar37 = vpackssdw_avx2(auVar42,auVar43);
  auVar60 = vpunpcklwd_avx2(auVar64,auVar67);
  auVar50 = vpunpckhwd_avx2(auVar64,auVar67);
  auVar42 = vpmaddwd_avx2(auVar60,auVar38);
  auVar43 = vpmaddwd_avx2(auVar50,auVar38);
  auVar60 = vpmaddwd_avx2(auVar60,auVar49);
  auVar50 = vpmaddwd_avx2(auVar50,auVar49);
  auVar42 = vpaddd_avx2(auVar42,auVar32);
  auVar43 = vpaddd_avx2(auVar43,auVar32);
  auVar60 = vpaddd_avx2(auVar60,auVar32);
  auVar50 = vpaddd_avx2(auVar50,auVar32);
  auVar42 = vpsrad_avx2(auVar42,auVar33);
  auVar43 = vpsrad_avx2(auVar43,auVar33);
  auVar60 = vpsrad_avx2(auVar60,auVar33);
  auVar50 = vpsrad_avx2(auVar50,auVar33);
  auVar42 = vpackssdw_avx2(auVar42,auVar43);
  auVar43 = vpackssdw_avx2(auVar60,auVar50);
  auVar48 = vpaddsw_avx2(auVar51,auVar16);
  auVar67 = vpsubsw_avx2(auVar51,auVar16);
  auVar60 = vpaddsw_avx2(auVar62,auVar14);
  auVar34 = vpsubsw_avx2(auVar62,auVar14);
  auVar64 = vpaddsw_avx2(auVar63,auVar18);
  auVar38 = vpsubsw_avx2(auVar63,auVar18);
  auVar50 = vpaddsw_avx2(auVar68,auVar46);
  auVar46 = vpsubsw_avx2(auVar46,auVar68);
  auVar47 = vpaddsw_avx2(auVar40,auVar66);
  auVar66 = vpsubsw_avx2(auVar66,auVar40);
  auVar51 = vpaddsw_avx2(auVar57,auVar41);
  auVar57 = vpsubsw_avx2(auVar57,auVar41);
  auVar63 = vpaddsw_avx2(auVar52,auVar17);
  auVar49 = vpsubsw_avx2(auVar52,auVar17);
  auVar68 = vpaddsw_avx2(auVar23,auVar15);
  auVar41 = vpsubsw_avx2(auVar23,auVar15);
  auVar15 = vpunpcklwd_avx2(auVar45,auVar54);
  auVar17 = vpunpckhwd_avx2(auVar45,auVar54);
  uVar31 = *(uint *)(&DAT_004e0e00 + lVar25);
  iVar27 = *(int *)(&DAT_004e0d40 + lVar29 * 0x20);
  uVar30 = uVar31 & 0xffff | iVar27 * 0x10000;
  auVar44._4_4_ = uVar30;
  auVar44._0_4_ = uVar30;
  auVar44._8_4_ = uVar30;
  auVar44._12_4_ = uVar30;
  auVar44._16_4_ = uVar30;
  auVar44._20_4_ = uVar30;
  auVar44._24_4_ = uVar30;
  auVar44._28_4_ = uVar30;
  uVar30 = uVar31 << 0x10 | -iVar27 & 0xffffU;
  auVar39._4_4_ = uVar30;
  auVar39._0_4_ = uVar30;
  auVar39._8_4_ = uVar30;
  auVar39._12_4_ = uVar30;
  auVar39._16_4_ = uVar30;
  auVar39._20_4_ = uVar30;
  auVar39._24_4_ = uVar30;
  auVar39._28_4_ = uVar30;
  auVar14 = vpmaddwd_avx2(auVar15,auVar44);
  auVar16 = vpmaddwd_avx2(auVar15,auVar39);
  auVar15 = vpmaddwd_avx2(auVar17,auVar44);
  auVar17 = vpmaddwd_avx2(auVar17,auVar39);
  auVar14 = vpaddd_avx2(auVar14,auVar32);
  auVar15 = vpaddd_avx2(auVar15,auVar32);
  auVar16 = vpaddd_avx2(auVar16,auVar32);
  auVar17 = vpaddd_avx2(auVar17,auVar32);
  auVar14 = vpsrad_avx2(auVar14,auVar33);
  auVar15 = vpsrad_avx2(auVar15,auVar33);
  auVar33 = ZEXT416(uVar26);
  auVar16 = vpsrad_avx2(auVar16,auVar33);
  auVar17 = vpsrad_avx2(auVar17,auVar33);
  auVar14 = vpackssdw_avx2(auVar14,auVar15);
  auVar15 = vpackssdw_avx2(auVar16,auVar17);
  auVar17 = vpunpcklwd_avx2(auVar55,auVar35);
  auVar40 = vpunpckhwd_avx2(auVar55,auVar35);
  uVar30 = *(uint *)(&DAT_004e0d80 + lVar25);
  iVar1 = *(int *)(&DAT_004e0dc0 + lVar25);
  uVar28 = uVar30 & 0xffff | iVar1 * 0x10000;
  auVar35._4_4_ = uVar28;
  auVar35._0_4_ = uVar28;
  auVar35._8_4_ = uVar28;
  auVar35._12_4_ = uVar28;
  auVar35._16_4_ = uVar28;
  auVar35._20_4_ = uVar28;
  auVar35._24_4_ = uVar28;
  auVar35._28_4_ = uVar28;
  uVar28 = uVar30 << 0x10 | -iVar1 & 0xffffU;
  auVar36._4_4_ = uVar28;
  auVar36._0_4_ = uVar28;
  auVar36._8_4_ = uVar28;
  auVar36._12_4_ = uVar28;
  auVar36._16_4_ = uVar28;
  auVar36._20_4_ = uVar28;
  auVar36._24_4_ = uVar28;
  auVar36._28_4_ = uVar28;
  auVar16 = vpmaddwd_avx2(auVar17,auVar35);
  auVar18 = vpmaddwd_avx2(auVar17,auVar36);
  auVar17 = vpmaddwd_avx2(auVar40,auVar35);
  auVar40 = vpmaddwd_avx2(auVar40,auVar36);
  auVar16 = vpaddd_avx2(auVar16,auVar32);
  auVar17 = vpaddd_avx2(auVar17,auVar32);
  auVar18 = vpaddd_avx2(auVar18,auVar32);
  auVar40 = vpaddd_avx2(auVar40,auVar32);
  auVar16 = vpsrad_avx2(auVar16,auVar33);
  auVar17 = vpsrad_avx2(auVar17,auVar33);
  auVar18 = vpsrad_avx2(auVar18,auVar33);
  auVar40 = vpsrad_avx2(auVar40,auVar33);
  auVar16 = vpackssdw_avx2(auVar16,auVar17);
  auVar17 = vpackssdw_avx2(auVar18,auVar40);
  auVar62 = vpaddsw_avx2(auVar24,auVar13);
  auVar52 = vpsubsw_avx2(auVar24,auVar13);
  auVar45 = vpaddsw_avx2(auVar58,auVar42);
  auVar23 = vpsubsw_avx2(auVar58,auVar42);
  auVar54 = vpaddsw_avx2(auVar43,auVar56);
  auVar55 = vpsubsw_avx2(auVar56,auVar43);
  auVar24 = vpaddsw_avx2(auVar53,auVar37);
  auVar53 = vpsubsw_avx2(auVar53,auVar37);
  auVar18 = vpunpcklwd_avx2(auVar60,auVar68);
  auVar37 = vpunpckhwd_avx2(auVar60,auVar68);
  auVar13 = vpmaddwd_avx2(auVar18,auVar39);
  auVar18 = vpmaddwd_avx2(auVar18,auVar44);
  auVar40 = vpmaddwd_avx2(auVar37,auVar44);
  auVar37 = vpmaddwd_avx2(auVar37,auVar39);
  auVar13 = vpaddd_avx2(auVar13,auVar32);
  auVar37 = vpaddd_avx2(auVar37,auVar32);
  auVar18 = vpaddd_avx2(auVar18,auVar32);
  auVar40 = vpaddd_avx2(auVar40,auVar32);
  auVar13 = vpsrad_avx2(auVar13,auVar33);
  auVar37 = vpsrad_avx2(auVar37,auVar33);
  auVar18 = vpsrad_avx2(auVar18,auVar33);
  auVar40 = vpsrad_avx2(auVar40,auVar33);
  auVar13 = vpackssdw_avx2(auVar13,auVar37);
  auVar37 = vpackssdw_avx2(auVar18,auVar40);
  auVar68 = vpunpcklwd_avx2(auVar34,auVar41);
  auVar41 = vpunpckhwd_avx2(auVar34,auVar41);
  iVar27 = (-uVar31 & 0xffff) + iVar27 * -0x10000;
  auVar60._4_4_ = iVar27;
  auVar60._0_4_ = iVar27;
  auVar60._8_4_ = iVar27;
  auVar60._12_4_ = iVar27;
  auVar60._16_4_ = iVar27;
  auVar60._20_4_ = iVar27;
  auVar60._24_4_ = iVar27;
  auVar60._28_4_ = iVar27;
  auVar18 = vpmaddwd_avx2(auVar60,auVar68);
  auVar40 = vpmaddwd_avx2(auVar60,auVar41);
  auVar68 = vpmaddwd_avx2(auVar68,auVar39);
  auVar41 = vpmaddwd_avx2(auVar41,auVar39);
  auVar18 = vpaddd_avx2(auVar18,auVar32);
  auVar42 = vpsrad_avx2(auVar18,auVar33);
  auVar18 = vpaddd_avx2(auVar40,auVar32);
  auVar18 = vpsrad_avx2(auVar18,auVar33);
  auVar18 = vpackssdw_avx2(auVar42,auVar18);
  auVar40 = vpaddd_avx2(auVar68,auVar32);
  auVar68 = vpaddd_avx2(auVar41,auVar32);
  auVar40 = vpsrad_avx2(auVar40,auVar33);
  auVar68 = vpsrad_avx2(auVar68,auVar33);
  auVar40 = vpackssdw_avx2(auVar40,auVar68);
  auVar41 = vpunpcklwd_avx2(auVar46,auVar57);
  auVar43 = vpunpckhwd_avx2(auVar46,auVar57);
  auVar68 = vpmaddwd_avx2(auVar41,auVar36);
  auVar41 = vpmaddwd_avx2(auVar41,auVar35);
  auVar42 = vpmaddwd_avx2(auVar43,auVar35);
  auVar43 = vpmaddwd_avx2(auVar43,auVar36);
  auVar68 = vpaddd_avx2(auVar68,auVar32);
  auVar60 = vpsrad_avx2(auVar68,auVar33);
  auVar68 = vpaddd_avx2(auVar43,auVar32);
  auVar68 = vpsrad_avx2(auVar68,auVar33);
  auVar68 = vpackssdw_avx2(auVar60,auVar68);
  auVar41 = vpaddd_avx2(auVar41,auVar32);
  auVar42 = vpaddd_avx2(auVar42,auVar32);
  auVar41 = vpsrad_avx2(auVar41,auVar33);
  auVar42 = vpsrad_avx2(auVar42,auVar33);
  auVar41 = vpackssdw_avx2(auVar41,auVar42);
  auVar60 = vpunpcklwd_avx2(auVar50,auVar51);
  auVar50 = vpunpckhwd_avx2(auVar50,auVar51);
  iVar27 = (-uVar30 & 0xffff) + iVar1 * -0x10000;
  auVar61._4_4_ = iVar27;
  auVar61._0_4_ = iVar27;
  auVar61._8_4_ = iVar27;
  auVar61._12_4_ = iVar27;
  auVar61._16_4_ = iVar27;
  auVar61._20_4_ = iVar27;
  auVar61._24_4_ = iVar27;
  auVar61._28_4_ = iVar27;
  auVar42 = vpmaddwd_avx2(auVar61,auVar60);
  auVar43 = vpmaddwd_avx2(auVar61,auVar50);
  auVar60 = vpmaddwd_avx2(auVar60,auVar36);
  auVar50 = vpmaddwd_avx2(auVar50,auVar36);
  auVar42 = vpaddd_avx2(auVar42,auVar32);
  auVar43 = vpaddd_avx2(auVar43,auVar32);
  auVar42 = vpsrad_avx2(auVar42,auVar33);
  auVar43 = vpsrad_avx2(auVar43,auVar33);
  auVar42 = vpackssdw_avx2(auVar42,auVar43);
  auVar43 = vpaddd_avx2(auVar60,auVar32);
  auVar60 = vpsrad_avx2(auVar43,auVar33);
  auVar43 = vpaddd_avx2(auVar50,auVar32);
  auVar43 = vpsrad_avx2(auVar43,auVar33);
  auVar43 = vpackssdw_avx2(auVar60,auVar43);
  auVar35 = vpunpcklwd_avx2(auVar62,auVar24);
  auVar51 = vpunpckhwd_avx2(auVar62,auVar24);
  uVar31 = LoadMaskz2[lVar29 * 8 + 7][4] << 0x10 | *(uint *)(&DAT_004e0e10 + lVar25) & 0xffff;
  auVar50._4_4_ = uVar31;
  auVar50._0_4_ = uVar31;
  auVar50._8_4_ = uVar31;
  auVar50._12_4_ = uVar31;
  auVar50._16_4_ = uVar31;
  auVar50._20_4_ = uVar31;
  auVar50._24_4_ = uVar31;
  auVar50._28_4_ = uVar31;
  uVar31 = *(uint *)(&DAT_004e0e10 + lVar25) << 0x10 | -LoadMaskz2[lVar29 * 8 + 7][4] & 0xffffU;
  auVar62._4_4_ = uVar31;
  auVar62._0_4_ = uVar31;
  auVar62._8_4_ = uVar31;
  auVar62._12_4_ = uVar31;
  auVar62._16_4_ = uVar31;
  auVar62._20_4_ = uVar31;
  auVar62._24_4_ = uVar31;
  auVar62._28_4_ = uVar31;
  auVar60 = vpmaddwd_avx2(auVar35,auVar50);
  auVar50 = vpmaddwd_avx2(auVar51,auVar50);
  auVar24 = vpmaddwd_avx2(auVar62,auVar35);
  auVar51 = vpmaddwd_avx2(auVar62,auVar51);
  auVar60 = vpaddd_avx2(auVar60,auVar32);
  auVar62 = vpsrad_avx2(auVar60,auVar33);
  auVar60 = vpaddd_avx2(auVar50,auVar32);
  auVar60 = vpsrad_avx2(auVar60,auVar33);
  auVar60 = vpackssdw_avx2(auVar62,auVar60);
  auVar50 = vpaddd_avx2(auVar24,auVar32);
  auVar24 = vpaddd_avx2(auVar51,auVar32);
  auVar50 = vpsrad_avx2(auVar50,auVar33);
  auVar24 = vpsrad_avx2(auVar24,auVar33);
  auVar50 = vpackssdw_avx2(auVar50,auVar24);
  auVar62 = vpunpcklwd_avx2(auVar52,auVar53);
  auVar52 = vpunpckhwd_avx2(auVar52,auVar53);
  uVar31 = *(int *)(&DAT_004e0db0 + lVar25) << 0x10 | *(uint *)(&DAT_004e0d90 + lVar25) & 0xffff;
  auVar51._4_4_ = uVar31;
  auVar51._0_4_ = uVar31;
  auVar51._8_4_ = uVar31;
  auVar51._12_4_ = uVar31;
  auVar51._16_4_ = uVar31;
  auVar51._20_4_ = uVar31;
  auVar51._24_4_ = uVar31;
  auVar51._28_4_ = uVar31;
  uVar31 = *(uint *)(&DAT_004e0d90 + lVar25) << 0x10 | -*(int *)(&DAT_004e0db0 + lVar25) & 0xffffU;
  auVar56._4_4_ = uVar31;
  auVar56._0_4_ = uVar31;
  auVar56._8_4_ = uVar31;
  auVar56._12_4_ = uVar31;
  auVar56._16_4_ = uVar31;
  auVar56._20_4_ = uVar31;
  auVar56._24_4_ = uVar31;
  auVar56._28_4_ = uVar31;
  auVar24 = vpmaddwd_avx2(auVar62,auVar51);
  auVar51 = vpmaddwd_avx2(auVar52,auVar51);
  auVar62 = vpmaddwd_avx2(auVar56,auVar62);
  auVar52 = vpmaddwd_avx2(auVar56,auVar52);
  auVar24 = vpaddd_avx2(auVar24,auVar32);
  auVar51 = vpaddd_avx2(auVar51,auVar32);
  auVar62 = vpaddd_avx2(auVar62,auVar32);
  auVar52 = vpaddd_avx2(auVar52,auVar32);
  auVar24 = vpsrad_avx2(auVar24,auVar33);
  auVar51 = vpsrad_avx2(auVar51,auVar33);
  auVar62 = vpsrad_avx2(auVar62,auVar33);
  auVar52 = vpsrad_avx2(auVar52,auVar33);
  auVar24 = vpackssdw_avx2(auVar24,auVar51);
  auVar51 = vpackssdw_avx2(auVar62,auVar52);
  auVar35 = vpunpcklwd_avx2(auVar23,auVar55);
  auVar53 = vpunpckhwd_avx2(auVar23,auVar55);
  uVar31 = *(int *)(&DAT_004e0d70 + lVar29 * 0x20) << 0x10 |
           *(uint *)(&DAT_004e0dd0 + lVar25) & 0xffff;
  auVar52._4_4_ = uVar31;
  auVar52._0_4_ = uVar31;
  auVar52._8_4_ = uVar31;
  auVar52._12_4_ = uVar31;
  auVar52._16_4_ = uVar31;
  auVar52._20_4_ = uVar31;
  auVar52._24_4_ = uVar31;
  auVar52._28_4_ = uVar31;
  uVar31 = *(uint *)(&DAT_004e0dd0 + lVar25) << 0x10 |
           -*(int *)(&DAT_004e0d70 + lVar29 * 0x20) & 0xffffU;
  auVar57._4_4_ = uVar31;
  auVar57._0_4_ = uVar31;
  auVar57._8_4_ = uVar31;
  auVar57._12_4_ = uVar31;
  auVar57._16_4_ = uVar31;
  auVar57._20_4_ = uVar31;
  auVar57._24_4_ = uVar31;
  auVar57._28_4_ = uVar31;
  auVar62 = vpmaddwd_avx2(auVar35,auVar52);
  auVar52 = vpmaddwd_avx2(auVar53,auVar52);
  auVar23 = vpmaddwd_avx2(auVar57,auVar35);
  auVar62 = vpaddd_avx2(auVar62,auVar32);
  auVar52 = vpaddd_avx2(auVar52,auVar32);
  auVar62 = vpsrad_avx2(auVar62,auVar33);
  auVar52 = vpsrad_avx2(auVar52,auVar33);
  auVar53 = vpmaddwd_avx2(auVar57,auVar53);
  auVar62 = vpackssdw_avx2(auVar62,auVar52);
  auVar52 = vpaddd_avx2(auVar23,auVar32);
  auVar23 = vpaddd_avx2(auVar53,auVar32);
  auVar52 = vpsrad_avx2(auVar52,auVar33);
  auVar23 = vpsrad_avx2(auVar23,auVar33);
  auVar52 = vpackssdw_avx2(auVar52,auVar23);
  auVar55 = vpunpcklwd_avx2(auVar45,auVar54);
  auVar54 = vpunpckhwd_avx2(auVar45,auVar54);
  uVar31 = *(int *)(&DAT_004e0df0 + lVar25) << 0x10 |
           *(uint *)(&DAT_004e0d50 + lVar29 * 0x20) & 0xffff;
  auVar53._4_4_ = uVar31;
  auVar53._0_4_ = uVar31;
  auVar53._8_4_ = uVar31;
  auVar53._12_4_ = uVar31;
  auVar53._16_4_ = uVar31;
  auVar53._20_4_ = uVar31;
  auVar53._24_4_ = uVar31;
  auVar53._28_4_ = uVar31;
  uVar31 = *(uint *)(&DAT_004e0d50 + lVar29 * 0x20) << 0x10 |
           -*(int *)(&DAT_004e0df0 + lVar25) & 0xffffU;
  auVar58._4_4_ = uVar31;
  auVar58._0_4_ = uVar31;
  auVar58._8_4_ = uVar31;
  auVar58._12_4_ = uVar31;
  auVar58._16_4_ = uVar31;
  auVar58._20_4_ = uVar31;
  auVar58._24_4_ = uVar31;
  auVar58._28_4_ = uVar31;
  auVar23 = vpmaddwd_avx2(auVar55,auVar53);
  auVar53 = vpmaddwd_avx2(auVar54,auVar53);
  auVar45 = vpmaddwd_avx2(auVar58,auVar55);
  auVar54 = vpmaddwd_avx2(auVar58,auVar54);
  auVar23 = vpaddd_avx2(auVar23,auVar32);
  auVar53 = vpaddd_avx2(auVar53,auVar32);
  auVar23 = vpsrad_avx2(auVar23,auVar33);
  auVar53 = vpsrad_avx2(auVar53,auVar33);
  auVar23 = vpackssdw_avx2(auVar23,auVar53);
  auVar53 = vpaddd_avx2(auVar45,auVar32);
  auVar45 = vpsrad_avx2(auVar53,auVar33);
  auVar53 = vpaddd_avx2(auVar54,auVar32);
  auVar53 = vpsrad_avx2(auVar53,auVar33);
  auVar53 = vpackssdw_avx2(auVar45,auVar53);
  auVar45 = vpaddsw_avx2(auVar48,auVar13);
  auVar35 = vpsubsw_avx2(auVar48,auVar13);
  auVar54 = vpaddsw_avx2(auVar18,auVar67);
  auVar46 = vpsubsw_avx2(auVar67,auVar18);
  auVar48 = vpaddsw_avx2(auVar38,auVar68);
  auVar56 = vpsubsw_avx2(auVar38,auVar68);
  auVar55 = vpaddsw_avx2(auVar42,auVar64);
  auVar67 = vpsubsw_avx2(auVar64,auVar42);
  auVar64 = vpaddsw_avx2(auVar47,auVar43);
  auVar57 = vpsubsw_avx2(auVar47,auVar43);
  auVar43 = vpaddsw_avx2(auVar41,auVar66);
  auVar66 = vpsubsw_avx2(auVar66,auVar41);
  auVar42 = vpaddsw_avx2(auVar49,auVar40);
  auVar47 = vpsubsw_avx2(auVar49,auVar40);
  auVar13 = vpaddsw_avx2(auVar63,auVar37);
  auVar41 = vpsubsw_avx2(auVar63,auVar37);
  auVar18 = vpunpcklwd_avx2(auVar45,auVar13);
  auVar40 = vpunpckhwd_avx2(auVar45,auVar13);
  uVar31 = LoadMaskz2[lVar29 * 8 + 7][2] << 0x10 | *(uint *)(&DAT_004e0e18 + lVar25) & 0xffff;
  auVar37._4_4_ = uVar31;
  auVar37._0_4_ = uVar31;
  auVar37._8_4_ = uVar31;
  auVar37._12_4_ = uVar31;
  auVar37._16_4_ = uVar31;
  auVar37._20_4_ = uVar31;
  auVar37._24_4_ = uVar31;
  auVar37._28_4_ = uVar31;
  uVar31 = *(uint *)(&DAT_004e0e18 + lVar25) << 0x10 | -LoadMaskz2[lVar29 * 8 + 7][2] & 0xffffU;
  auVar68._4_4_ = uVar31;
  auVar68._0_4_ = uVar31;
  auVar68._8_4_ = uVar31;
  auVar68._12_4_ = uVar31;
  auVar68._16_4_ = uVar31;
  auVar68._20_4_ = uVar31;
  auVar68._24_4_ = uVar31;
  auVar68._28_4_ = uVar31;
  auVar13 = vpmaddwd_avx2(auVar18,auVar37);
  auVar37 = vpmaddwd_avx2(auVar40,auVar37);
  auVar18 = vpmaddwd_avx2(auVar68,auVar18);
  auVar40 = vpmaddwd_avx2(auVar68,auVar40);
  auVar13 = vpaddd_avx2(auVar13,auVar32);
  auVar68 = vpsrad_avx2(auVar13,auVar33);
  auVar13 = vpaddd_avx2(auVar37,auVar32);
  auVar13 = vpsrad_avx2(auVar13,auVar33);
  auVar13 = vpackssdw_avx2(auVar68,auVar13);
  auVar37 = vpaddd_avx2(auVar18,auVar32);
  auVar18 = vpaddd_avx2(auVar40,auVar32);
  auVar37 = vpsrad_avx2(auVar37,auVar33);
  auVar18 = vpsrad_avx2(auVar18,auVar33);
  auVar37 = vpackssdw_avx2(auVar37,auVar18);
  auVar68 = vpunpcklwd_avx2(auVar35,auVar41);
  auVar41 = vpunpckhwd_avx2(auVar35,auVar41);
  uVar31 = *(int *)(&DAT_004e0da8 + lVar25) << 0x10 | *(uint *)(&DAT_004e0d98 + lVar25) & 0xffff;
  auVar40._4_4_ = uVar31;
  auVar40._0_4_ = uVar31;
  auVar40._8_4_ = uVar31;
  auVar40._12_4_ = uVar31;
  auVar40._16_4_ = uVar31;
  auVar40._20_4_ = uVar31;
  auVar40._24_4_ = uVar31;
  auVar40._28_4_ = uVar31;
  uVar31 = *(uint *)(&DAT_004e0d98 + lVar25) << 0x10 | -*(int *)(&DAT_004e0da8 + lVar25) & 0xffffU;
  auVar45._4_4_ = uVar31;
  auVar45._0_4_ = uVar31;
  auVar45._8_4_ = uVar31;
  auVar45._12_4_ = uVar31;
  auVar45._16_4_ = uVar31;
  auVar45._20_4_ = uVar31;
  auVar45._24_4_ = uVar31;
  auVar45._28_4_ = uVar31;
  auVar18 = vpmaddwd_avx2(auVar68,auVar40);
  auVar40 = vpmaddwd_avx2(auVar41,auVar40);
  auVar68 = vpmaddwd_avx2(auVar68,auVar45);
  auVar41 = vpmaddwd_avx2(auVar41,auVar45);
  auVar18 = vpaddd_avx2(auVar18,auVar32);
  auVar40 = vpaddd_avx2(auVar40,auVar32);
  auVar68 = vpaddd_avx2(auVar68,auVar32);
  auVar41 = vpaddd_avx2(auVar41,auVar32);
  auVar18 = vpsrad_avx2(auVar18,auVar33);
  auVar40 = vpsrad_avx2(auVar40,auVar33);
  auVar68 = vpsrad_avx2(auVar68,auVar33);
  auVar41 = vpsrad_avx2(auVar41,auVar33);
  auVar18 = vpackssdw_avx2(auVar18,auVar40);
  auVar40 = vpackssdw_avx2(auVar68,auVar41);
  auVar45 = vpunpcklwd_avx2(auVar46,auVar47);
  auVar63 = vpunpckhwd_avx2(auVar46,auVar47);
  uVar31 = *(int *)(&DAT_004e0d68 + lVar29 * 0x20) << 0x10 |
           *(uint *)(&DAT_004e0dd8 + lVar25) & 0xffff;
  auVar41._4_4_ = uVar31;
  auVar41._0_4_ = uVar31;
  auVar41._8_4_ = uVar31;
  auVar41._12_4_ = uVar31;
  auVar41._16_4_ = uVar31;
  auVar41._20_4_ = uVar31;
  auVar41._24_4_ = uVar31;
  auVar41._28_4_ = uVar31;
  uVar31 = *(uint *)(&DAT_004e0dd8 + lVar25) << 0x10 |
           -*(int *)(&DAT_004e0d68 + lVar29 * 0x20) & 0xffffU;
  auVar46._4_4_ = uVar31;
  auVar46._0_4_ = uVar31;
  auVar46._8_4_ = uVar31;
  auVar46._12_4_ = uVar31;
  auVar46._16_4_ = uVar31;
  auVar46._20_4_ = uVar31;
  auVar46._24_4_ = uVar31;
  auVar46._28_4_ = uVar31;
  auVar68 = vpmaddwd_avx2(auVar45,auVar41);
  auVar41 = vpmaddwd_avx2(auVar63,auVar41);
  auVar45 = vpmaddwd_avx2(auVar45,auVar46);
  auVar68 = vpaddd_avx2(auVar68,auVar32);
  auVar41 = vpaddd_avx2(auVar41,auVar32);
  auVar68 = vpsrad_avx2(auVar68,auVar33);
  auVar47 = vpsrad_avx2(auVar41,auVar33);
  auVar41 = vpmaddwd_avx2(auVar63,auVar46);
  alVar2 = (__m256i)vpackssdw_avx2(auVar68,auVar47);
  auVar68 = vpaddd_avx2(auVar45,auVar32);
  auVar41 = vpaddd_avx2(auVar41,auVar32);
  auVar68 = vpsrad_avx2(auVar68,auVar33);
  auVar41 = vpsrad_avx2(auVar41,auVar33);
  auVar68 = vpackssdw_avx2(auVar68,auVar41);
  auVar45 = vpunpcklwd_avx2(auVar54,auVar42);
  auVar54 = vpunpckhwd_avx2(auVar54,auVar42);
  uVar31 = *(int *)(&DAT_004e0de8 + lVar25) << 0x10 |
           *(uint *)(&DAT_004e0d58 + lVar29 * 0x20) & 0xffff;
  auVar42._4_4_ = uVar31;
  auVar42._0_4_ = uVar31;
  auVar42._8_4_ = uVar31;
  auVar42._12_4_ = uVar31;
  auVar42._16_4_ = uVar31;
  auVar42._20_4_ = uVar31;
  auVar42._24_4_ = uVar31;
  auVar42._28_4_ = uVar31;
  uVar31 = *(uint *)(&DAT_004e0d58 + lVar29 * 0x20) << 0x10 |
           -*(int *)(&DAT_004e0de8 + lVar25) & 0xffffU;
  auVar47._4_4_ = uVar31;
  auVar47._0_4_ = uVar31;
  auVar47._8_4_ = uVar31;
  auVar47._12_4_ = uVar31;
  auVar47._16_4_ = uVar31;
  auVar47._20_4_ = uVar31;
  auVar47._24_4_ = uVar31;
  auVar47._28_4_ = uVar31;
  auVar41 = vpmaddwd_avx2(auVar45,auVar42);
  auVar42 = vpmaddwd_avx2(auVar54,auVar42);
  auVar45 = vpmaddwd_avx2(auVar45,auVar47);
  auVar54 = vpmaddwd_avx2(auVar54,auVar47);
  auVar41 = vpaddd_avx2(auVar41,auVar32);
  auVar42 = vpaddd_avx2(auVar42,auVar32);
  auVar41 = vpsrad_avx2(auVar41,auVar33);
  auVar42 = vpsrad_avx2(auVar42,auVar33);
  alVar3 = (__m256i)vpackssdw_avx2(auVar41,auVar42);
  auVar41 = vpaddd_avx2(auVar45,auVar32);
  auVar42 = vpsrad_avx2(auVar41,auVar33);
  auVar41 = vpaddd_avx2(auVar54,auVar32);
  auVar41 = vpsrad_avx2(auVar41,auVar33);
  alVar4 = (__m256i)vpackssdw_avx2(auVar42,auVar41);
  auVar54 = vpunpcklwd_avx2(auVar48,auVar43);
  auVar45 = vpunpckhwd_avx2(auVar48,auVar43);
  uVar31 = *(int *)(&DAT_004e0d48 + lVar29 * 0x20) << 0x10 |
           *(uint *)(&DAT_004e0df8 + lVar25) & 0xffff;
  auVar43._4_4_ = uVar31;
  auVar43._0_4_ = uVar31;
  auVar43._8_4_ = uVar31;
  auVar43._12_4_ = uVar31;
  auVar43._16_4_ = uVar31;
  auVar43._20_4_ = uVar31;
  auVar43._24_4_ = uVar31;
  auVar43._28_4_ = uVar31;
  uVar31 = *(uint *)(&DAT_004e0df8 + lVar25) << 0x10 |
           -*(int *)(&DAT_004e0d48 + lVar29 * 0x20) & 0xffffU;
  auVar48._4_4_ = uVar31;
  auVar48._0_4_ = uVar31;
  auVar48._8_4_ = uVar31;
  auVar48._12_4_ = uVar31;
  auVar48._16_4_ = uVar31;
  auVar48._20_4_ = uVar31;
  auVar48._24_4_ = uVar31;
  auVar48._28_4_ = uVar31;
  auVar41 = vpmaddwd_avx2(auVar54,auVar43);
  auVar42 = vpmaddwd_avx2(auVar45,auVar43);
  auVar43 = vpmaddwd_avx2(auVar54,auVar48);
  auVar45 = vpmaddwd_avx2(auVar45,auVar48);
  auVar41 = vpaddd_avx2(auVar41,auVar32);
  auVar54 = vpsrad_avx2(auVar41,auVar33);
  auVar41 = vpaddd_avx2(auVar42,auVar32);
  auVar41 = vpsrad_avx2(auVar41,auVar33);
  alVar5 = (__m256i)vpackssdw_avx2(auVar54,auVar41);
  auVar41 = vpaddd_avx2(auVar43,auVar32);
  auVar42 = vpaddd_avx2(auVar45,auVar32);
  auVar41 = vpsrad_avx2(auVar41,auVar33);
  auVar42 = vpsrad_avx2(auVar42,auVar33);
  alVar6 = (__m256i)vpackssdw_avx2(auVar41,auVar42);
  auVar43 = vpunpcklwd_avx2(auVar56,auVar66);
  auVar45 = vpunpckhwd_avx2(auVar56,auVar66);
  uVar31 = *(int *)(&DAT_004e0dc8 + lVar25) << 0x10 | *(uint *)(&DAT_004e0d78 + lVar25) & 0xffff;
  auVar54._4_4_ = uVar31;
  auVar54._0_4_ = uVar31;
  auVar54._8_4_ = uVar31;
  auVar54._12_4_ = uVar31;
  auVar54._16_4_ = uVar31;
  auVar54._20_4_ = uVar31;
  auVar54._24_4_ = uVar31;
  auVar54._28_4_ = uVar31;
  uVar31 = *(uint *)(&DAT_004e0d78 + lVar25) << 0x10 | -*(int *)(&DAT_004e0dc8 + lVar25) & 0xffffU;
  auVar63._4_4_ = uVar31;
  auVar63._0_4_ = uVar31;
  auVar63._8_4_ = uVar31;
  auVar63._12_4_ = uVar31;
  auVar63._16_4_ = uVar31;
  auVar63._20_4_ = uVar31;
  auVar63._24_4_ = uVar31;
  auVar63._28_4_ = uVar31;
  auVar41 = vpmaddwd_avx2(auVar43,auVar54);
  auVar42 = vpmaddwd_avx2(auVar45,auVar54);
  auVar43 = vpmaddwd_avx2(auVar63,auVar43);
  auVar45 = vpmaddwd_avx2(auVar63,auVar45);
  auVar41 = vpaddd_avx2(auVar41,auVar32);
  auVar42 = vpaddd_avx2(auVar42,auVar32);
  auVar43 = vpaddd_avx2(auVar43,auVar32);
  auVar45 = vpaddd_avx2(auVar45,auVar32);
  auVar41 = vpsrad_avx2(auVar41,auVar33);
  auVar42 = vpsrad_avx2(auVar42,auVar33);
  auVar43 = vpsrad_avx2(auVar43,auVar33);
  auVar45 = vpsrad_avx2(auVar45,auVar33);
  alVar7 = (__m256i)vpackssdw_avx2(auVar41,auVar42);
  alVar8 = (__m256i)vpackssdw_avx2(auVar43,auVar45);
  auVar43 = vpunpcklwd_avx2(auVar67,auVar57);
  auVar54 = vpunpckhwd_avx2(auVar67,auVar57);
  uVar31 = *(int *)(&DAT_004e0d88 + lVar25) << 0x10 | *(uint *)(&DAT_004e0db8 + lVar25) & 0xffff;
  auVar66._4_4_ = uVar31;
  auVar66._0_4_ = uVar31;
  auVar66._8_4_ = uVar31;
  auVar66._12_4_ = uVar31;
  auVar66._16_4_ = uVar31;
  auVar66._20_4_ = uVar31;
  auVar66._24_4_ = uVar31;
  auVar66._28_4_ = uVar31;
  uVar31 = *(uint *)(&DAT_004e0db8 + lVar25) << 0x10 | -*(int *)(&DAT_004e0d88 + lVar25) & 0xffffU;
  auVar69._4_4_ = uVar31;
  auVar69._0_4_ = uVar31;
  auVar69._8_4_ = uVar31;
  auVar69._12_4_ = uVar31;
  auVar69._16_4_ = uVar31;
  auVar69._20_4_ = uVar31;
  auVar69._24_4_ = uVar31;
  auVar69._28_4_ = uVar31;
  auVar41 = vpmaddwd_avx2(auVar66,auVar43);
  auVar42 = vpmaddwd_avx2(auVar54,auVar66);
  auVar43 = vpmaddwd_avx2(auVar69,auVar43);
  auVar41 = vpaddd_avx2(auVar41,auVar32);
  auVar42 = vpaddd_avx2(auVar42,auVar32);
  auVar41 = vpsrad_avx2(auVar41,auVar33);
  auVar45 = vpsrad_avx2(auVar42,auVar33);
  auVar42 = vpmaddwd_avx2(auVar54,auVar69);
  alVar9 = (__m256i)vpackssdw_avx2(auVar41,auVar45);
  auVar41 = vpaddd_avx2(auVar43,auVar32);
  auVar42 = vpaddd_avx2(auVar42,auVar32);
  auVar33 = ZEXT416(uVar26);
  auVar41 = vpsrad_avx2(auVar41,auVar33);
  auVar42 = vpsrad_avx2(auVar42,auVar33);
  alVar10 = (__m256i)vpackssdw_avx2(auVar41,auVar42);
  auVar43 = vpunpcklwd_avx2(auVar55,auVar64);
  auVar45 = vpunpckhwd_avx2(auVar55,auVar64);
  uVar31 = *(int *)(&DAT_004e0e08 + lVar25) << 0x10 | LoadMaskz2[lVar29 * 8 + 7][6] & 0xffffU;
  auVar67._4_4_ = uVar31;
  auVar67._0_4_ = uVar31;
  auVar67._8_4_ = uVar31;
  auVar67._12_4_ = uVar31;
  auVar67._16_4_ = uVar31;
  auVar67._20_4_ = uVar31;
  auVar67._24_4_ = uVar31;
  auVar67._28_4_ = uVar31;
  uVar31 = LoadMaskz2[lVar29 * 8 + 7][6] << 0x10 | -*(int *)(&DAT_004e0e08 + lVar25) & 0xffffU;
  auVar64._4_4_ = uVar31;
  auVar64._0_4_ = uVar31;
  auVar64._8_4_ = uVar31;
  auVar64._12_4_ = uVar31;
  auVar64._16_4_ = uVar31;
  auVar64._20_4_ = uVar31;
  auVar64._24_4_ = uVar31;
  auVar64._28_4_ = uVar31;
  auVar41 = vpmaddwd_avx2(auVar67,auVar43);
  auVar42 = vpmaddwd_avx2(auVar67,auVar45);
  auVar43 = vpmaddwd_avx2(auVar64,auVar43);
  auVar45 = vpmaddwd_avx2(auVar64,auVar45);
  auVar41 = vpaddd_avx2(auVar41,auVar32);
  auVar42 = vpaddd_avx2(auVar42,auVar32);
  auVar43 = vpaddd_avx2(auVar43,auVar32);
  auVar45 = vpaddd_avx2(auVar45,auVar32);
  auVar41 = vpsrad_avx2(auVar41,auVar33);
  auVar42 = vpsrad_avx2(auVar42,auVar33);
  auVar43 = vpsrad_avx2(auVar43,auVar33);
  alVar11 = (__m256i)vpackssdw_avx2(auVar41,auVar42);
  auVar41 = vpsrad_avx2(auVar45,auVar33);
  alVar12 = (__m256i)vpackssdw_avx2(auVar43,auVar41);
  local_d8 = auVar19._0_8_;
  lStack_d0 = auVar19._8_8_;
  lStack_c8 = auVar19._16_8_;
  lStack_c0 = auVar19._24_8_;
  (*output)[0] = local_d8;
  (*output)[1] = lStack_d0;
  (*output)[2] = lStack_c8;
  (*output)[3] = lStack_c0;
  local_298 = auVar13._0_8_;
  lStack_290 = auVar13._8_8_;
  lStack_288 = auVar13._16_8_;
  lStack_280 = auVar13._24_8_;
  output[1][0] = local_298;
  output[1][1] = lStack_290;
  output[1][2] = lStack_288;
  output[1][3] = lStack_280;
  local_238 = auVar60._0_8_;
  lStack_230 = auVar60._8_8_;
  lStack_228 = auVar60._16_8_;
  lStack_220 = auVar60._24_8_;
  output[2][0] = local_238;
  output[2][1] = lStack_230;
  output[2][2] = lStack_228;
  output[2][3] = lStack_220;
  output[3] = alVar12;
  local_138 = auVar14._0_8_;
  lStack_130 = auVar14._8_8_;
  lStack_128 = auVar14._16_8_;
  lStack_120 = auVar14._24_8_;
  output[4][0] = local_138;
  output[4][1] = lStack_130;
  output[4][2] = lStack_128;
  output[4][3] = lStack_120;
  output[5] = alVar5;
  local_3f8 = auVar53._0_8_;
  lStack_3f0 = auVar53._8_8_;
  lStack_3e8 = auVar53._16_8_;
  lStack_3e0 = auVar53._24_8_;
  output[6][0] = local_3f8;
  output[6][1] = lStack_3f0;
  output[6][2] = lStack_3e8;
  output[6][3] = lStack_3e0;
  output[7] = alVar4;
  local_f8 = auVar21._0_8_;
  lStack_f0 = auVar21._8_8_;
  lStack_e8 = auVar21._16_8_;
  lStack_e0 = auVar21._24_8_;
  output[8][0] = local_f8;
  output[8][1] = lStack_f0;
  output[8][2] = lStack_e8;
  output[8][3] = lStack_e0;
  output[9] = alVar2;
  local_398 = auVar62._0_8_;
  lStack_390 = auVar62._8_8_;
  lStack_388 = auVar62._16_8_;
  lStack_380 = auVar62._24_8_;
  output[10][0] = local_398;
  output[10][1] = lStack_390;
  output[10][2] = lStack_388;
  output[10][3] = lStack_380;
  output[0xb] = alVar8;
  local_178 = auVar17._0_8_;
  lStack_170 = auVar17._8_8_;
  lStack_168 = auVar17._16_8_;
  lStack_160 = auVar17._24_8_;
  output[0xc][0] = local_178;
  output[0xc][1] = lStack_170;
  output[0xc][2] = lStack_168;
  output[0xc][3] = lStack_160;
  output[0xd] = alVar9;
  local_1b8 = auVar51._0_8_;
  lStack_1b0 = auVar51._8_8_;
  lStack_1a8 = auVar51._16_8_;
  lStack_1a0 = auVar51._24_8_;
  output[0xe][0] = local_1b8;
  output[0xe][1] = lStack_1b0;
  output[0xe][2] = lStack_1a8;
  output[0xe][3] = lStack_1a0;
  local_2f8 = auVar40._0_8_;
  lStack_2f0 = auVar40._8_8_;
  lStack_2e8 = auVar40._16_8_;
  lStack_2e0 = auVar40._24_8_;
  output[0xf][0] = local_2f8;
  output[0xf][1] = lStack_2f0;
  output[0xf][2] = lStack_2e8;
  output[0xf][3] = lStack_2e0;
  local_98 = auVar20._0_8_;
  lStack_90 = auVar20._8_8_;
  lStack_88 = auVar20._16_8_;
  lStack_80 = auVar20._24_8_;
  output[0x10][0] = local_98;
  output[0x10][1] = lStack_90;
  output[0x10][2] = lStack_88;
  output[0x10][3] = lStack_80;
  local_2d8 = auVar18._0_8_;
  lStack_2d0 = auVar18._8_8_;
  lStack_2c8 = auVar18._16_8_;
  lStack_2c0 = auVar18._24_8_;
  output[0x11][0] = local_2d8;
  output[0x11][1] = lStack_2d0;
  output[0x11][2] = lStack_2c8;
  output[0x11][3] = lStack_2c0;
  local_198 = auVar24._0_8_;
  lStack_190 = auVar24._8_8_;
  lStack_188 = auVar24._16_8_;
  lStack_180 = auVar24._24_8_;
  output[0x12][0] = local_198;
  output[0x12][1] = lStack_190;
  output[0x12][2] = lStack_188;
  output[0x12][3] = lStack_180;
  output[0x13] = alVar10;
  local_158 = auVar16._0_8_;
  lStack_150 = auVar16._8_8_;
  lStack_148 = auVar16._16_8_;
  lStack_140 = auVar16._24_8_;
  output[0x14][0] = local_158;
  output[0x14][1] = lStack_150;
  output[0x14][2] = lStack_148;
  output[0x14][3] = lStack_140;
  output[0x15] = alVar7;
  local_378 = auVar52._0_8_;
  lStack_370 = auVar52._8_8_;
  lStack_368 = auVar52._16_8_;
  lStack_360 = auVar52._24_8_;
  output[0x16][0] = local_378;
  output[0x16][1] = lStack_370;
  output[0x16][2] = lStack_368;
  output[0x16][3] = lStack_360;
  local_3d8 = auVar68._0_8_;
  lStack_3d0 = auVar68._8_8_;
  lStack_3c8 = auVar68._16_8_;
  lStack_3c0 = auVar68._24_8_;
  output[0x17][0] = local_3d8;
  output[0x17][1] = lStack_3d0;
  output[0x17][2] = lStack_3c8;
  output[0x17][3] = lStack_3c0;
  local_b8 = auVar22._0_8_;
  lStack_b0 = auVar22._8_8_;
  lStack_a8 = auVar22._16_8_;
  lStack_a0 = auVar22._24_8_;
  output[0x18][0] = local_b8;
  output[0x18][1] = lStack_b0;
  output[0x18][2] = lStack_a8;
  output[0x18][3] = lStack_a0;
  output[0x19] = alVar3;
  local_258 = auVar23._0_8_;
  lStack_250 = auVar23._8_8_;
  lStack_248 = auVar23._16_8_;
  lStack_240 = auVar23._24_8_;
  output[0x1a][0] = local_258;
  output[0x1a][1] = lStack_250;
  output[0x1a][2] = lStack_248;
  output[0x1a][3] = lStack_240;
  output[0x1b] = alVar6;
  local_118 = auVar15._0_8_;
  lStack_110 = auVar15._8_8_;
  lStack_108 = auVar15._16_8_;
  lStack_100 = auVar15._24_8_;
  output[0x1c][0] = local_118;
  output[0x1c][1] = lStack_110;
  output[0x1c][2] = lStack_108;
  output[0x1c][3] = lStack_100;
  output[0x1d] = alVar11;
  local_218 = auVar50._0_8_;
  lStack_210 = auVar50._8_8_;
  lStack_208 = auVar50._16_8_;
  lStack_200 = auVar50._24_8_;
  output[0x1e][0] = local_218;
  output[0x1e][1] = lStack_210;
  output[0x1e][2] = lStack_208;
  output[0x1e][3] = lStack_200;
  local_278 = auVar37._0_8_;
  lStack_270 = auVar37._8_8_;
  lStack_268 = auVar37._16_8_;
  lStack_260 = auVar37._24_8_;
  output[0x1f][0] = local_278;
  output[0x1f][1] = lStack_270;
  output[0x1f][2] = lStack_268;
  output[0x1f][3] = lStack_260;
  return;
}

Assistant:

static inline void fdct16x32_avx2(const __m256i *input, __m256i *output,
                                  int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i _r = _mm256_set1_epi32(1 << (cos_bit - 1));

  __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);
  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p56_p08 = pair_set_w16_epi16(cospi[56], cospi[8]);
  __m256i cospi_m08_p56 = pair_set_w16_epi16(-cospi[8], cospi[56]);
  __m256i cospi_p24_p40 = pair_set_w16_epi16(cospi[24], cospi[40]);
  __m256i cospi_m40_p24 = pair_set_w16_epi16(-cospi[40], cospi[24]);
  __m256i cospi_m56_m08 = pair_set_w16_epi16(-cospi[56], -cospi[8]);
  __m256i cospi_m24_m40 = pair_set_w16_epi16(-cospi[24], -cospi[40]);
  __m256i cospi_p60_p04 = pair_set_w16_epi16(cospi[60], cospi[4]);
  __m256i cospi_m04_p60 = pair_set_w16_epi16(-cospi[4], cospi[60]);
  __m256i cospi_p28_p36 = pair_set_w16_epi16(cospi[28], cospi[36]);
  __m256i cospi_m36_p28 = pair_set_w16_epi16(-cospi[36], cospi[28]);
  __m256i cospi_p44_p20 = pair_set_w16_epi16(cospi[44], cospi[20]);
  __m256i cospi_m20_p44 = pair_set_w16_epi16(-cospi[20], cospi[44]);
  __m256i cospi_p12_p52 = pair_set_w16_epi16(cospi[12], cospi[52]);
  __m256i cospi_m52_p12 = pair_set_w16_epi16(-cospi[52], cospi[12]);
  __m256i cospi_p62_p02 = pair_set_w16_epi16(cospi[62], cospi[2]);
  __m256i cospi_m02_p62 = pair_set_w16_epi16(-cospi[2], cospi[62]);
  __m256i cospi_p30_p34 = pair_set_w16_epi16(cospi[30], cospi[34]);
  __m256i cospi_m34_p30 = pair_set_w16_epi16(-cospi[34], cospi[30]);
  __m256i cospi_p46_p18 = pair_set_w16_epi16(cospi[46], cospi[18]);
  __m256i cospi_m18_p46 = pair_set_w16_epi16(-cospi[18], cospi[46]);
  __m256i cospi_p14_p50 = pair_set_w16_epi16(cospi[14], cospi[50]);
  __m256i cospi_m50_p14 = pair_set_w16_epi16(-cospi[50], cospi[14]);
  __m256i cospi_p54_p10 = pair_set_w16_epi16(cospi[54], cospi[10]);
  __m256i cospi_m10_p54 = pair_set_w16_epi16(-cospi[10], cospi[54]);
  __m256i cospi_p22_p42 = pair_set_w16_epi16(cospi[22], cospi[42]);
  __m256i cospi_m42_p22 = pair_set_w16_epi16(-cospi[42], cospi[22]);
  __m256i cospi_p38_p26 = pair_set_w16_epi16(cospi[38], cospi[26]);
  __m256i cospi_m26_p38 = pair_set_w16_epi16(-cospi[26], cospi[38]);
  __m256i cospi_p06_p58 = pair_set_w16_epi16(cospi[6], cospi[58]);
  __m256i cospi_m58_p06 = pair_set_w16_epi16(-cospi[58], cospi[6]);

  // stage 1
  __m256i x1[32];
  btf_16_adds_subs_out_avx2(&x1[0], &x1[31], input[0], input[31]);
  btf_16_adds_subs_out_avx2(&x1[1], &x1[30], input[1], input[30]);
  btf_16_adds_subs_out_avx2(&x1[2], &x1[29], input[2], input[29]);
  btf_16_adds_subs_out_avx2(&x1[3], &x1[28], input[3], input[28]);
  btf_16_adds_subs_out_avx2(&x1[4], &x1[27], input[4], input[27]);
  btf_16_adds_subs_out_avx2(&x1[5], &x1[26], input[5], input[26]);
  btf_16_adds_subs_out_avx2(&x1[6], &x1[25], input[6], input[25]);
  btf_16_adds_subs_out_avx2(&x1[7], &x1[24], input[7], input[24]);
  btf_16_adds_subs_out_avx2(&x1[8], &x1[23], input[8], input[23]);
  btf_16_adds_subs_out_avx2(&x1[9], &x1[22], input[9], input[22]);
  btf_16_adds_subs_out_avx2(&x1[10], &x1[21], input[10], input[21]);
  btf_16_adds_subs_out_avx2(&x1[11], &x1[20], input[11], input[20]);
  btf_16_adds_subs_out_avx2(&x1[12], &x1[19], input[12], input[19]);
  btf_16_adds_subs_out_avx2(&x1[13], &x1[18], input[13], input[18]);
  btf_16_adds_subs_out_avx2(&x1[14], &x1[17], input[14], input[17]);
  btf_16_adds_subs_out_avx2(&x1[15], &x1[16], input[15], input[16]);

  // stage 2
  btf_16_adds_subs_avx2(&x1[0], &x1[15]);
  btf_16_adds_subs_avx2(&x1[1], &x1[14]);
  btf_16_adds_subs_avx2(&x1[2], &x1[13]);
  btf_16_adds_subs_avx2(&x1[3], &x1[12]);
  btf_16_adds_subs_avx2(&x1[4], &x1[11]);
  btf_16_adds_subs_avx2(&x1[5], &x1[10]);
  btf_16_adds_subs_avx2(&x1[6], &x1[9]);
  btf_16_adds_subs_avx2(&x1[7], &x1[8]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[20], &x1[27], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[21], &x1[26], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[22], &x1[25], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[23], &x1[24], _r, cos_bit);

  // stage 3
  btf_16_adds_subs_avx2(&x1[0], &x1[7]);
  btf_16_adds_subs_avx2(&x1[1], &x1[6]);
  btf_16_adds_subs_avx2(&x1[2], &x1[5]);
  btf_16_adds_subs_avx2(&x1[3], &x1[4]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[10], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[11], &x1[12], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[16], &x1[23]);
  btf_16_adds_subs_avx2(&x1[17], &x1[22]);
  btf_16_adds_subs_avx2(&x1[18], &x1[21]);
  btf_16_adds_subs_avx2(&x1[19], &x1[20]);
  btf_16_adds_subs_avx2(&x1[31], &x1[24]);
  btf_16_adds_subs_avx2(&x1[30], &x1[25]);
  btf_16_adds_subs_avx2(&x1[29], &x1[26]);
  btf_16_adds_subs_avx2(&x1[28], &x1[27]);

  // stage 4
  btf_16_adds_subs_avx2(&x1[0], &x1[3]);
  btf_16_adds_subs_avx2(&x1[1], &x1[2]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[5], &x1[6], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[8], &x1[11]);
  btf_16_adds_subs_avx2(&x1[9], &x1[10]);
  btf_16_adds_subs_avx2(&x1[15], &x1[12]);
  btf_16_adds_subs_avx2(&x1[14], &x1[13]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x1[18], &x1[29], _r, cos_bit);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x1[19], &x1[28], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x1[20], &x1[27], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x1[21], &x1[26], _r, cos_bit);

  // stage 5
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[0], &x1[1], _r, cos_bit);
  btf_16_w16_avx2(cospi_p48_p16, cospi_m16_p48, &x1[2], &x1[3], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[4], &x1[5]);
  btf_16_adds_subs_avx2(&x1[7], &x1[6]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x1[9], &x1[14], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x1[10], &x1[13], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[16], &x1[19]);
  btf_16_adds_subs_avx2(&x1[17], &x1[18]);
  btf_16_adds_subs_avx2(&x1[23], &x1[20]);
  btf_16_adds_subs_avx2(&x1[22], &x1[21]);
  btf_16_adds_subs_avx2(&x1[24], &x1[27]);
  btf_16_adds_subs_avx2(&x1[25], &x1[26]);
  btf_16_adds_subs_avx2(&x1[31], &x1[28]);
  btf_16_adds_subs_avx2(&x1[30], &x1[29]);

  // stage 6
  btf_16_w16_avx2(cospi_p56_p08, cospi_m08_p56, &x1[4], &x1[7], _r, cos_bit);
  btf_16_w16_avx2(cospi_p24_p40, cospi_m40_p24, &x1[5], &x1[6], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[8], &x1[9]);
  btf_16_adds_subs_avx2(&x1[11], &x1[10]);
  btf_16_adds_subs_avx2(&x1[12], &x1[13]);
  btf_16_adds_subs_avx2(&x1[15], &x1[14]);
  btf_16_w16_avx2(cospi_m08_p56, cospi_p56_p08, &x1[17], &x1[30], _r, cos_bit);
  btf_16_w16_avx2(cospi_m56_m08, cospi_m08_p56, &x1[18], &x1[29], _r, cos_bit);
  btf_16_w16_avx2(cospi_m40_p24, cospi_p24_p40, &x1[21], &x1[26], _r, cos_bit);
  btf_16_w16_avx2(cospi_m24_m40, cospi_m40_p24, &x1[22], &x1[25], _r, cos_bit);

  // stage 7
  btf_16_w16_avx2(cospi_p60_p04, cospi_m04_p60, &x1[8], &x1[15], _r, cos_bit);
  btf_16_w16_avx2(cospi_p28_p36, cospi_m36_p28, &x1[9], &x1[14], _r, cos_bit);
  btf_16_w16_avx2(cospi_p44_p20, cospi_m20_p44, &x1[10], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_p12_p52, cospi_m52_p12, &x1[11], &x1[12], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[16], &x1[17]);
  btf_16_adds_subs_avx2(&x1[19], &x1[18]);
  btf_16_adds_subs_avx2(&x1[20], &x1[21]);
  btf_16_adds_subs_avx2(&x1[23], &x1[22]);
  btf_16_adds_subs_avx2(&x1[24], &x1[25]);
  btf_16_adds_subs_avx2(&x1[27], &x1[26]);
  btf_16_adds_subs_avx2(&x1[28], &x1[29]);
  btf_16_adds_subs_avx2(&x1[31], &x1[30]);

  // stage 8
  btf_16_w16_avx2(cospi_p62_p02, cospi_m02_p62, &x1[16], &x1[31], _r, cos_bit);
  btf_16_w16_avx2(cospi_p30_p34, cospi_m34_p30, &x1[17], &x1[30], _r, cos_bit);
  btf_16_w16_avx2(cospi_p46_p18, cospi_m18_p46, &x1[18], &x1[29], _r, cos_bit);
  btf_16_w16_avx2(cospi_p14_p50, cospi_m50_p14, &x1[19], &x1[28], _r, cos_bit);
  btf_16_w16_avx2(cospi_p54_p10, cospi_m10_p54, &x1[20], &x1[27], _r, cos_bit);
  btf_16_w16_avx2(cospi_p22_p42, cospi_m42_p22, &x1[21], &x1[26], _r, cos_bit);
  btf_16_w16_avx2(cospi_p38_p26, cospi_m26_p38, &x1[22], &x1[25], _r, cos_bit);
  btf_16_w16_avx2(cospi_p06_p58, cospi_m58_p06, &x1[23], &x1[24], _r, cos_bit);

  // stage 9
  output[0] = x1[0];
  output[1] = x1[16];
  output[2] = x1[8];
  output[3] = x1[24];
  output[4] = x1[4];
  output[5] = x1[20];
  output[6] = x1[12];
  output[7] = x1[28];
  output[8] = x1[2];
  output[9] = x1[18];
  output[10] = x1[10];
  output[11] = x1[26];
  output[12] = x1[6];
  output[13] = x1[22];
  output[14] = x1[14];
  output[15] = x1[30];
  output[16] = x1[1];
  output[17] = x1[17];
  output[18] = x1[9];
  output[19] = x1[25];
  output[20] = x1[5];
  output[21] = x1[21];
  output[22] = x1[13];
  output[23] = x1[29];
  output[24] = x1[3];
  output[25] = x1[19];
  output[26] = x1[11];
  output[27] = x1[27];
  output[28] = x1[7];
  output[29] = x1[23];
  output[30] = x1[15];
  output[31] = x1[31];
}